

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O1

int uv_loop_init(uv_loop_t *loop)

{
  uint *puVar1;
  byte *pbVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  uint64_t uVar6;
  
  uv__signal_global_once_init();
  pvVar4 = loop->data;
  memset(loop,0,0x350);
  loop->data = pvVar4;
  (loop->timer_heap).min = (void *)0x0;
  (loop->timer_heap).nelts = 0;
  loop->wq[0] = loop->wq;
  loop->wq[1] = loop->wq;
  loop->active_reqs[0] = loop->active_reqs;
  loop->active_reqs[1] = loop->active_reqs;
  loop->idle_handles[0] = loop->idle_handles;
  loop->idle_handles[1] = loop->idle_handles;
  loop->async_handles[0] = loop->async_handles;
  loop->async_handles[1] = loop->async_handles;
  loop->check_handles[0] = loop->check_handles;
  loop->check_handles[1] = loop->check_handles;
  loop->prepare_handles[0] = loop->prepare_handles;
  loop->prepare_handles[1] = loop->prepare_handles;
  loop->handle_queue[0] = loop->handle_queue;
  loop->handle_queue[1] = loop->handle_queue;
  loop->watchers = (uv__io_t **)0x0;
  loop->nwatchers = 0;
  loop->nfds = 0;
  loop->pending_queue[0] = loop->pending_queue;
  loop->pending_queue[1] = loop->pending_queue;
  loop->watcher_queue[0] = loop->watcher_queue;
  loop->watcher_queue[1] = loop->watcher_queue;
  loop->closing_handles = (uv_handle_t *)0x0;
  uVar6 = uv__hrtime(UV_CLOCK_FAST);
  loop->time = uVar6 / 1000000;
  (loop->async_io_watcher).fd = -1;
  loop->async_wfd = -1;
  loop->signal_pipefd[0] = -1;
  loop->signal_pipefd[1] = -1;
  loop->backend_fd = -1;
  loop->emfile_fd = -1;
  loop->timer_counter = 0;
  loop->stop_flag = 0;
  iVar5 = uv__platform_loop_init(loop);
  if (iVar5 == 0) {
    iVar5 = uv_signal_init(loop,&loop->child_watcher);
    if (iVar5 == 0) {
      uVar3 = (loop->child_watcher).flags;
      if (((uVar3 >> 0xd & 1) != 0) &&
         ((loop->child_watcher).flags = uVar3 & 0xffffdfff, (uVar3 >> 0xe & 1) != 0)) {
        puVar1 = &((loop->child_watcher).loop)->active_handles;
        *puVar1 = *puVar1 - 1;
      }
      pbVar2 = (byte *)((long)&(loop->child_watcher).flags + 1);
      *pbVar2 = *pbVar2 | 0x80;
      loop->process_handles[0] = loop->process_handles;
      loop->process_handles[1] = loop->process_handles;
      iVar5 = uv_rwlock_init(&loop->cloexec_lock);
      if (iVar5 == 0) {
        iVar5 = uv_mutex_init(&loop->wq_mutex);
        if (iVar5 == 0) {
          iVar5 = uv_async_init(loop,&loop->wq_async,uv__work_done);
          if (iVar5 == 0) {
            uVar3 = (loop->wq_async).flags;
            if (((uVar3 >> 0xd & 1) != 0) &&
               ((loop->wq_async).flags = uVar3 & 0xffffdfff, (uVar3 >> 0xe & 1) != 0)) {
              puVar1 = &((loop->wq_async).loop)->active_handles;
              *puVar1 = *puVar1 - 1;
            }
            pbVar2 = (byte *)((long)&(loop->wq_async).flags + 1);
            *pbVar2 = *pbVar2 | 0x80;
            return 0;
          }
          uv_mutex_destroy(&loop->wq_mutex);
        }
        uv_rwlock_destroy(&loop->cloexec_lock);
      }
      uv__signal_loop_cleanup(loop);
    }
    uv__platform_loop_delete(loop);
  }
  return iVar5;
}

Assistant:

int uv_loop_init(uv_loop_t* loop) {
  void* saved_data;
  int err;

  uv__signal_global_once_init();

  saved_data = loop->data;
  memset(loop, 0, sizeof(*loop));
  loop->data = saved_data;

  heap_init((struct heap*) &loop->timer_heap);
  QUEUE_INIT(&loop->wq);
  QUEUE_INIT(&loop->active_reqs);
  QUEUE_INIT(&loop->idle_handles);
  QUEUE_INIT(&loop->async_handles);
  QUEUE_INIT(&loop->check_handles);
  QUEUE_INIT(&loop->prepare_handles);
  QUEUE_INIT(&loop->handle_queue);

  loop->nfds = 0;
  loop->watchers = NULL;
  loop->nwatchers = 0;
  QUEUE_INIT(&loop->pending_queue);
  QUEUE_INIT(&loop->watcher_queue);

  loop->closing_handles = NULL;
  uv__update_time(loop);
  loop->async_io_watcher.fd = -1;
  loop->async_wfd = -1;
  loop->signal_pipefd[0] = -1;
  loop->signal_pipefd[1] = -1;
  loop->backend_fd = -1;
  loop->emfile_fd = -1;

  loop->timer_counter = 0;
  loop->stop_flag = 0;

  err = uv__platform_loop_init(loop);
  if (err)
    return err;

  err = uv_signal_init(loop, &loop->child_watcher);
  if (err)
    goto fail_signal_init;

  uv__handle_unref(&loop->child_watcher);
  loop->child_watcher.flags |= UV__HANDLE_INTERNAL;
  QUEUE_INIT(&loop->process_handles);

  err = uv_rwlock_init(&loop->cloexec_lock);
  if (err)
    goto fail_rwlock_init;

  err = uv_mutex_init(&loop->wq_mutex);
  if (err)
    goto fail_mutex_init;

  err = uv_async_init(loop, &loop->wq_async, uv__work_done);
  if (err)
    goto fail_async_init;

  uv__handle_unref(&loop->wq_async);
  loop->wq_async.flags |= UV__HANDLE_INTERNAL;

  return 0;

fail_async_init:
  uv_mutex_destroy(&loop->wq_mutex);

fail_mutex_init:
  uv_rwlock_destroy(&loop->cloexec_lock);

fail_rwlock_init:
  uv__signal_loop_cleanup(loop);

fail_signal_init:
  uv__platform_loop_delete(loop);

  return err;
}